

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

znzFile nifti_image_open(char *hname,char *opts,nifti_image **nim)

{
  int use_compression;
  nifti_image *pnVar1;
  znzFile pzVar2;
  char *pcVar3;
  char *pcVar4;
  
  pnVar1 = nifti_image_read(hname,0);
  *nim = pnVar1;
  pcVar3 = "bad header info";
  if ((((pnVar1 != (nifti_image *)0x0) && (pcVar4 = pnVar1->iname, pcVar4 != (char *)0x0)) &&
      (0 < pnVar1->nbyper)) && (pnVar1->nvox != 0)) {
    use_compression = nifti_is_gzfile(pcVar4);
    pzVar2 = znzopen(pcVar4,opts,use_compression);
    if (pzVar2 != (znzFile)0x0) {
      return pzVar2;
    }
    pcVar3 = "Can\'t open data file";
  }
  pcVar4 = "(null)";
  if (hname != (char *)0x0) {
    pcVar4 = hname;
  }
  fprintf(_stderr,"** ERROR: nifti_image_open(%s): %s\n",pcVar4,pcVar3);
  return (znzFile)0x0;
}

Assistant:

znzFile nifti_image_open(const char * hname, char * opts, nifti_image ** nim)
{
  znzFile fptr=NULL;
  /* open the hdr and reading it in, but do not load the data  */
  *nim = nifti_image_read(hname,0);
  /* open the image file, ready for reading (compressed works for all reads) */
  if( ((*nim) == NULL)      || ((*nim)->iname == NULL) ||
      ((*nim)->nbyper <= 0) || ((*nim)->nvox <= 0)       )
     ERREX("bad header info") ;

  /* open image data file */
  fptr = znzopen( (*nim)->iname, opts, nifti_is_gzfile((*nim)->iname) );
  if( znz_isnull(fptr) ) ERREX("Can't open data file") ;

  return fptr;
}